

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

wostream * Centaurus::operator<<(wostream *os,PriorityChain *chain)

{
  pointer pPVar1;
  long lVar2;
  ulong uVar3;
  
  std::operator<<(os,L'{');
  lVar2 = 0;
  for (uVar3 = 1;
      pPVar1 = (chain->
               super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               ).
               super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(chain->
                             super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                             ).
                             super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x30);
      uVar3 = uVar3 + 1) {
    operator<<(os,(PriorityChainElement *)((long)&(pPVar1->m_id)._vptr_Identifier + lVar2));
    std::operator<<(os,L'>');
    lVar2 = lVar2 + 0x30;
  }
  std::operator<<(os,L'}');
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChain& chain)
{
    os << L'{';
    for (int i = 0; i + 1 < chain.size(); i++)
    {
        os << chain[i] << L'>';
    }
    os << L'}';
    return os;
}